

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O3

void run_xor_test(void)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  array_container_t *container;
  array_container_t *container_00;
  array_container_t *container_01;
  array_container_t *container_02;
  bitset_container_t *src_2;
  bitset_container_t *src_2_00;
  bitset_container_t *src_2_01;
  bitset_container_t *bitset;
  run_container_t *run;
  run_container_t *run_00;
  run_container_t *run_01;
  run_container_t *run_02;
  unsigned_long a;
  array_container_t *container_03;
  uint16_t *puVar4;
  ushort uVar5;
  int x_4;
  int iVar6;
  int32_t iVar7;
  uint uVar8;
  ulong uVar9;
  ushort uVar10;
  int x;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  container_t *C;
  array_container_t *local_38;
  
  container = array_container_create();
  container_00 = array_container_create();
  container_01 = array_container_create();
  container_02 = array_container_create();
  src_2 = bitset_container_create();
  src_2_00 = bitset_container_create();
  src_2_01 = bitset_container_create();
  bitset = bitset_container_create();
  run = run_container_create();
  run_00 = run_container_create();
  run_01 = run_container_create();
  uVar12 = 0;
  run_02 = run_container_create();
  do {
    uVar5 = (ushort)uVar12;
    if ((ushort)(uVar5 + (short)(((uint)uVar12 & 0xffff) / 5) * -5) < 3) {
      iVar6 = container->cardinality;
      if (((long)iVar6 == 0) ||
         ((puVar4 = container->array, iVar6 != 0x7fffffff && (puVar4[(long)iVar6 + -1] < uVar5)))) {
        if (iVar6 == container->capacity) {
          array_container_grow(container,iVar6 + 1,true);
          iVar6 = container->cardinality;
        }
        container->cardinality = iVar6 + 1;
        container->array[iVar6] = uVar5;
      }
      else {
        if (iVar6 < 1) {
          uVar13 = 0;
        }
        else {
          iVar3 = iVar6 + -1;
          uVar13 = 0;
          do {
            uVar2 = iVar3 + (int)uVar13;
            uVar11 = uVar2 >> 1;
            uVar10 = *(ushort *)((long)puVar4 + (ulong)(uVar2 & 0xfffffffe));
            if (uVar10 < uVar5) {
              uVar13 = (ulong)(uVar11 + 1);
            }
            else {
              if (uVar10 <= uVar5) goto LAB_001044be;
              iVar3 = uVar11 - 1;
            }
          } while ((int)uVar13 <= iVar3);
          if (iVar6 == 0x7fffffff) goto LAB_001044be;
        }
        if (iVar6 == container->capacity) {
          array_container_grow(container,iVar6 + 1,true);
          puVar4 = container->array;
        }
        memmove(puVar4 + uVar13 + 1,puVar4 + uVar13,(long)(iVar6 - (int)uVar13) * 2);
        container->array[uVar13] = uVar5;
        container->cardinality = container->cardinality + 1;
      }
LAB_001044be:
      uVar13 = src_2->words[uVar12 >> 6];
      uVar9 = uVar13 | 1L << (uVar12 & 0x3f);
      src_2->cardinality = src_2->cardinality + (int)((uVar13 ^ uVar9) >> ((byte)uVar12 & 0x3f));
      src_2->words[uVar12 >> 6] = uVar9;
      run_container_add(run,uVar5);
    }
    uVar11 = (uint)uVar12 + 1;
    uVar12 = (ulong)uVar11;
  } while (uVar11 != 0x10000);
  uVar12 = 0;
  do {
    uVar5 = (ushort)uVar12;
    uVar11 = (uint)((uVar12 & 0xffff) >> 1) / 0x1f;
    if ((ushort)(((short)uVar11 * 2 - (short)(uVar11 << 6)) + uVar5) < 0x25) {
      iVar6 = container_00->cardinality;
      if (((long)iVar6 == 0) ||
         ((puVar4 = container_00->array, iVar6 != 0x7fffffff && (puVar4[(long)iVar6 + -1] < uVar5)))
         ) {
        if (iVar6 == container_00->capacity) {
          array_container_grow(container_00,iVar6 + 1,true);
          iVar6 = container_00->cardinality;
        }
        container_00->cardinality = iVar6 + 1;
        container_00->array[iVar6] = uVar5;
      }
      else {
        if (iVar6 < 1) {
          uVar13 = 0;
        }
        else {
          iVar3 = iVar6 + -1;
          uVar13 = 0;
          do {
            uVar2 = iVar3 + (int)uVar13;
            uVar11 = uVar2 >> 1;
            uVar10 = *(ushort *)((long)puVar4 + (ulong)(uVar2 & 0xfffffffe));
            if (uVar10 < uVar5) {
              uVar13 = (ulong)(uVar11 + 1);
            }
            else {
              if (uVar10 <= uVar5) goto LAB_00104609;
              iVar3 = uVar11 - 1;
            }
          } while ((int)uVar13 <= iVar3);
          if (iVar6 == 0x7fffffff) goto LAB_00104609;
        }
        if (iVar6 == container_00->capacity) {
          array_container_grow(container_00,iVar6 + 1,true);
          puVar4 = container_00->array;
        }
        memmove(puVar4 + uVar13 + 1,puVar4 + uVar13,(long)(iVar6 - (int)uVar13) * 2);
        container_00->array[uVar13] = uVar5;
        container_00->cardinality = container_00->cardinality + 1;
      }
LAB_00104609:
      uVar13 = src_2_00->words[uVar12 >> 6];
      uVar9 = uVar13 | 1L << (uVar12 & 0x3f);
      src_2_00->cardinality =
           src_2_00->cardinality + (int)((uVar13 ^ uVar9) >> ((byte)uVar12 & 0x3f));
      src_2_00->words[uVar12 >> 6] = uVar9;
      run_container_add(run_00,uVar5);
    }
    uVar11 = (int)uVar12 + 1;
    uVar12 = (ulong)uVar11;
  } while (uVar11 != 0x10000);
  uVar12 = 0;
  do {
    uVar5 = (ushort)uVar12;
    uVar11 = (uint)uVar12 & 0xffff;
    uVar2 = uVar11 / 0x3e;
    if ((ushort)(((short)uVar2 * 2 - (short)(uVar2 << 6)) + uVar5) < 0x25 !=
        (ushort)(uVar5 + (short)(uVar11 / 5) * -5) < 3) {
      iVar6 = container_02->cardinality;
      if (((long)iVar6 == 0) ||
         ((puVar4 = container_02->array, iVar6 != 0x7fffffff && (puVar4[(long)iVar6 + -1] < uVar5)))
         ) {
        if (iVar6 == container_02->capacity) {
          array_container_grow(container_02,iVar6 + 1,true);
          iVar6 = container_02->cardinality;
        }
        container_02->cardinality = iVar6 + 1;
        container_02->array[iVar6] = uVar5;
      }
      else {
        if (iVar6 < 1) {
          uVar13 = 0;
        }
        else {
          iVar3 = iVar6 + -1;
          uVar13 = 0;
          do {
            uVar2 = iVar3 + (int)uVar13;
            uVar11 = uVar2 >> 1;
            uVar10 = *(ushort *)((long)puVar4 + (ulong)(uVar2 & 0xfffffffe));
            if (uVar10 < uVar5) {
              uVar13 = (ulong)(uVar11 + 1);
            }
            else {
              if (uVar10 <= uVar5) goto LAB_00104768;
              iVar3 = uVar11 - 1;
            }
          } while ((int)uVar13 <= iVar3);
          if (iVar6 == 0x7fffffff) goto LAB_00104768;
        }
        if (iVar6 == container_02->capacity) {
          array_container_grow(container_02,iVar6 + 1,true);
          puVar4 = container_02->array;
        }
        memmove(puVar4 + uVar13 + 1,puVar4 + uVar13,(long)(iVar6 - (int)uVar13) * 2);
        container_02->array[uVar13] = uVar5;
        container_02->cardinality = container_02->cardinality + 1;
      }
LAB_00104768:
      uVar13 = bitset->words[uVar12 >> 6];
      uVar9 = uVar13 | 1L << (uVar12 & 0x3f);
      bitset->cardinality = bitset->cardinality + (int)((uVar13 ^ uVar9) >> ((byte)uVar12 & 0x3f));
      bitset->words[uVar12 >> 6] = uVar9;
    }
    uVar11 = (uint)uVar12 + 1;
    uVar12 = (ulong)uVar11;
  } while (uVar11 != 0x10000);
  uVar12 = 0;
  do {
    uVar10 = (ushort)uVar12;
    uVar11 = (uint)uVar12;
    uVar5 = uVar10 + (short)((uVar11 & 0xffff) / 5) * -5;
    if ((uVar5 < 2) || (10000 < uVar11 && uVar5 == 2)) {
      iVar6 = container_01->cardinality;
      if (((long)iVar6 == 0) ||
         ((puVar4 = container_01->array, iVar6 != 0x7fffffff && (puVar4[(long)iVar6 + -1] < uVar10))
         )) {
        if (iVar6 == container_01->capacity) {
          array_container_grow(container_01,iVar6 + 1,true);
          iVar6 = container_01->cardinality;
        }
        container_01->cardinality = iVar6 + 1;
        container_01->array[iVar6] = uVar10;
      }
      else {
        if (iVar6 < 1) {
          uVar13 = 0;
        }
        else {
          iVar3 = iVar6 + -1;
          uVar13 = 0;
          do {
            uVar8 = iVar3 + (int)uVar13;
            uVar2 = uVar8 >> 1;
            uVar5 = *(ushort *)((long)puVar4 + (ulong)(uVar8 & 0xfffffffe));
            if (uVar5 < uVar10) {
              uVar13 = (ulong)(uVar2 + 1);
            }
            else {
              if (uVar5 <= uVar10) goto LAB_001048a8;
              iVar3 = uVar2 - 1;
            }
          } while ((int)uVar13 <= iVar3);
          if (iVar6 == 0x7fffffff) goto LAB_001048a8;
        }
        if (iVar6 == container_01->capacity) {
          array_container_grow(container_01,iVar6 + 1,true);
          puVar4 = container_01->array;
        }
        memmove(puVar4 + uVar13 + 1,puVar4 + uVar13,(long)(iVar6 - (int)uVar13) * 2);
        container_01->array[uVar13] = uVar10;
        container_01->cardinality = container_01->cardinality + 1;
      }
LAB_001048a8:
      uVar13 = src_2_01->words[uVar12 >> 6];
      uVar9 = uVar13 | 1L << (uVar12 & 0x3f);
      src_2_01->cardinality =
           src_2_01->cardinality + (int)((uVar13 ^ uVar9) >> ((byte)uVar12 & 0x3f));
      src_2_01->words[uVar12 >> 6] = uVar9;
      run_container_add(run_01,uVar10);
    }
    uVar12 = (ulong)(uVar11 + 1);
  } while (uVar11 + 1 != 0x10000);
  uVar11 = 1;
  iVar6 = 0;
  do {
    if ((uVar11 & 3) != 0) {
      run_container_add(run_02,(uint16_t)iVar6);
    }
    uVar11 = (uVar11 * 0xd68 + 0x1a85) % 0x26f5;
    iVar6 = iVar6 + 1;
  } while (iVar6 != 0x10000);
  a = (unsigned_long)container_02->cardinality;
  local_38 = (array_container_t *)0x0;
  _Var1 = run_bitset_container_xor(run,src_2,&local_38);
  _assert_true((ulong)!_Var1,"run_bitset_container_xor(R1, B1, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x23d);
  _assert_int_equal(0,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x23e);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  iVar6 = array_run_container_xor(container,run,&local_38);
  _assert_int_equal(2,(long)iVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x242);
  _assert_int_equal(0,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x243);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  iVar6 = run_run_container_xor(run,run,&local_38);
  _assert_int_equal(3,(long)iVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x249);
  iVar6 = run_container_cardinality((run_container_t *)local_38);
  _assert_int_equal(0,(long)iVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x24a);
  run_container_free((run_container_t *)local_38);
  local_38 = (array_container_t *)0x0;
  _Var1 = run_bitset_container_xor(run,src_2_01,&local_38);
  _assert_true((ulong)!_Var1,"run_bitset_container_xor(R1, B3, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x24e);
  _assert_int_equal(2000,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x24f);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  iVar6 = array_run_container_xor(container_01,run,&local_38);
  _assert_int_equal(2,(long)iVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x253);
  _assert_int_equal(2000,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x254);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  iVar6 = run_run_container_xor(run,run_01,&local_38);
  _assert_int_equal(2,(long)iVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,600);
  _assert_int_equal(2000,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x259);
  array_container_free(local_38);
  local_38 = (array_container_t *)0x0;
  _Var1 = run_bitset_container_xor(run,src_2_00,&local_38);
  _assert_true((ulong)_Var1,"run_bitset_container_xor(R1, B2, &C)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
               ,0x25d);
  _assert_int_equal(a,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x25e);
  bitset_container_free((bitset_container_t *)local_38);
  local_38 = (array_container_t *)0x0;
  iVar6 = array_run_container_xor(container_00,run,&local_38);
  _assert_int_equal(1,(long)iVar6,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x263);
  _assert_int_equal(a,(long)local_38->cardinality,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x264);
  bitset_container_free((bitset_container_t *)local_38);
  local_38 = (array_container_t *)0x0;
  container_03 = array_container_create();
  iVar7 = container_03->cardinality;
  iVar6 = 1000;
  do {
    uVar5 = (ushort)iVar6;
    if ((iVar7 == 0) ||
       ((puVar4 = container_03->array, iVar7 != 0x7fffffff && (puVar4[(long)iVar7 + -1] < uVar5))))
    {
      if (iVar7 == container_03->capacity) {
        array_container_grow(container_03,iVar7 + 1,true);
        iVar7 = container_03->cardinality;
      }
      container_03->cardinality = iVar7 + 1;
      container_03->array[iVar7] = uVar5;
      iVar3 = iVar7 + 1;
    }
    else {
      if (iVar7 < 1) {
        uVar12 = 0;
      }
      else {
        iVar3 = iVar7 + -1;
        uVar12 = 0;
        do {
          uVar2 = iVar3 + (int)uVar12;
          uVar11 = uVar2 >> 1;
          uVar10 = *(ushort *)((long)puVar4 + (ulong)(uVar2 & 0xfffffffe));
          if (uVar10 < uVar5) {
            uVar12 = (ulong)(uVar11 + 1);
          }
          else {
            iVar3 = iVar7;
            if (uVar10 <= uVar5) goto LAB_00104cb8;
            iVar3 = uVar11 - 1;
          }
        } while ((int)uVar12 <= iVar3);
        iVar3 = 0x7fffffff;
        if (iVar7 == 0x7fffffff) goto LAB_00104cb8;
      }
      if (iVar7 == container_03->capacity) {
        array_container_grow(container_03,iVar7 + 1,true);
        puVar4 = container_03->array;
      }
      memmove(puVar4 + uVar12 + 1,puVar4 + uVar12,(long)(iVar7 - (int)uVar12) * 2);
      container_03->array[uVar12] = uVar5;
      iVar3 = container_03->cardinality + 1;
      container_03->cardinality = iVar3;
    }
LAB_00104cb8:
    iVar7 = iVar3;
    iVar6 = iVar6 + 1;
    if (iVar6 == 0x3f2) {
      iVar6 = array_run_container_xor(container_03,run_00,&local_38);
      _assert_int_equal(3,(long)iVar6,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x26c);
      iVar6 = run_container_cardinality((run_container_t *)local_38);
      _assert_int_equal(0x98bd,(long)iVar6,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x26d);
      run_container_free((run_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      iVar6 = run_run_container_xor(run,run_00,&local_38);
      _assert_int_equal(1,(long)iVar6,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x271);
      _assert_int_equal(a,(long)local_38->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x272);
      bitset_container_free((bitset_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      _Var1 = run_bitset_container_xor(run_02,src_2_01,&local_38);
      _assert_true((ulong)_Var1,"run_bitset_container_xor(R4, B3, &C)",
                   "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                   ,0x276);
      iVar6 = local_38->cardinality;
      bitset_container_free((bitset_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      iVar3 = array_run_container_xor(container_01,run_02,&local_38);
      _assert_int_equal(1,(long)iVar3,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x27d);
      _assert_int_equal((long)iVar6,(long)local_38->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x27f);
      bitset_container_free((bitset_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      iVar3 = run_run_container_xor(run_02,run_01,&local_38);
      _assert_int_equal(1,(long)iVar3,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x283);
      _assert_int_equal((long)iVar6,(long)local_38->cardinality,
                        "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                        ,0x284);
      bitset_container_free((bitset_container_t *)local_38);
      local_38 = (array_container_t *)0x0;
      array_container_free(container);
      array_container_free(container_00);
      array_container_free(container_01);
      array_container_free(container_02);
      array_container_free(container_03);
      bitset_container_free(src_2);
      bitset_container_free(src_2_00);
      bitset_container_free(src_2_01);
      bitset_container_free(bitset);
      run_container_free(run);
      run_container_free(run_00);
      run_container_free(run_01);
      run_container_free(run_02);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(run_xor_test) {
    array_container_t* A1 = array_container_create();
    array_container_t* A2 = array_container_create();
    array_container_t* A3 = array_container_create();
    array_container_t* AX = array_container_create();
    bitset_container_t* B1 = bitset_container_create();
    bitset_container_t* B2 = bitset_container_create();
    bitset_container_t* B3 = bitset_container_create();
    bitset_container_t* BX = bitset_container_create();
    run_container_t* R1 = run_container_create();
    run_container_t* R2 = run_container_create();
    run_container_t* R3 = run_container_create();
    run_container_t* R4 = run_container_create();

    // B/A1 xor R1 is empty (array or run, I guess)
    // B/A1 xor R2 is probably best left as runs
    // B/A3 xor R1 is best as an array.
    // B/A3 xor R4 is best as a bitmap

    // nb, array containers will be illegally big.
    for (int x = 0; x < (1 << 16); x++) {
        if (x % 5 < 3) {
            array_container_add(A1, x);
            bitset_container_set(B1, x);
            run_container_add(R1, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 62 < 37) {
            array_container_add(A2, x);
            bitset_container_set(B2, x);
            run_container_add(R2, x);
        }
    }

    for (int x = 0; x < (1 << 16); x++)
        if ((x % 62 < 37) ^ (x % 5 < 3)) {
            array_container_add(AX, x);
            bitset_container_set(BX, x);
        }

    // the elements x%5 == 2 differ for less than 10k, otherwise same)
    for (int x = 0; x < (1 << 16); x++) {
        if ((x % 5 < 2) || ((x % 5 < 3) && (x > 10000))) {
            array_container_add(A3, x);
            bitset_container_set(B3, x);
            run_container_add(R3, x);
        }
    }

    int randstate = 1;  // for Oakenfull RNG, hope LSBits are nice
    for (int x = 0; x < (1 << 16); x++) {
        if (randstate % 4) {
            run_container_add(R4, x);
        }
        randstate = (3432 * randstate + 6789) % 9973;
    }

    int cx12 = array_container_cardinality(AX);  // expected xor for ?1 and ?2

    container_t* C = NULL;

    assert_false(run_bitset_container_xor(R1, B1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, array_run_container_xor(A1, R1, &C));
    assert_int_equal(0, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    // both run coding and array coding have same serialized size for
    // empty
    assert_int_equal(RUN_CONTAINER_TYPE, run_run_container_xor(R1, R1, &C));
    assert_int_equal(0, run_container_cardinality(CAST_run(C)));
    run_container_free(CAST_run(C));
    C = NULL;

    assert_false(run_bitset_container_xor(R1, B3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, array_run_container_xor(A3, R1, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_int_equal(ARRAY_CONTAINER_TYPE, run_run_container_xor(R1, R3, &C));
    assert_int_equal(2000, array_container_cardinality(CAST_array(C)));
    array_container_free(CAST_array(C));
    C = NULL;

    assert_true(run_bitset_container_xor(R1, B2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_xor(A2, R1, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_t* A_small = array_container_create();
    for (int i = 1000; i < 1010; ++i) array_container_add(A_small, i);

    assert_int_equal(RUN_CONTAINER_TYPE,
                     array_run_container_xor(A_small, R2, &C));
    assert_int_equal(0x98bd, run_container_cardinality(CAST_run(C)));
    run_container_free(CAST_run(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE, run_run_container_xor(R1, R2, &C));
    assert_int_equal(cx12, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_true(run_bitset_container_xor(R4, B3, &C));
    int card_3_4 = bitset_container_cardinality(CAST_bitset(C));
    // assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE,
                     array_run_container_xor(A3, R4, &C));
    // if this fails, either this bitset is wrong or the previous one...
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    assert_int_equal(BITSET_CONTAINER_TYPE, run_run_container_xor(R4, R3, &C));
    assert_int_equal(card_3_4, bitset_container_cardinality(CAST_bitset(C)));
    bitset_container_free(CAST_bitset(C));
    C = NULL;

    array_container_free(A1);
    array_container_free(A2);
    array_container_free(A3);
    array_container_free(AX);
    array_container_free(A_small);

    bitset_container_free(B1);
    bitset_container_free(B2);
    bitset_container_free(B3);
    bitset_container_free(BX);

    run_container_free(R1);
    run_container_free(R2);
    run_container_free(R3);
    run_container_free(R4);
}